

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOutput_SetProgressIndicator_Test::~TEST_TestOutput_SetProgressIndicator_Test
          (TEST_TestOutput_SetProgressIndicator_Test *this)

{
  TEST_TestOutput_SetProgressIndicator_Test *this_local;
  
  ~TEST_TestOutput_SetProgressIndicator_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(TestOutput, SetProgressIndicator)
{
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator("!");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);

    STRCMP_EQUAL(".!.", mock->getOutput().asCharString());
}